

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad_gl.c
# Opt level: O0

void glad_gl_load_GL_ARB_robustness(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_robustness != 0) {
    glad_glGetGraphicsResetStatusARB =
         (PFNGLGETGRAPHICSRESETSTATUSARBPROC)(*load)("glGetGraphicsResetStatusARB",userptr);
    glad_glGetnColorTableARB = (PFNGLGETNCOLORTABLEARBPROC)(*load)("glGetnColorTableARB",userptr);
    glad_glGetnCompressedTexImageARB =
         (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC)(*load)("glGetnCompressedTexImageARB",userptr);
    glad_glGetnConvolutionFilterARB =
         (PFNGLGETNCONVOLUTIONFILTERARBPROC)(*load)("glGetnConvolutionFilterARB",userptr);
    glad_glGetnHistogramARB = (PFNGLGETNHISTOGRAMARBPROC)(*load)("glGetnHistogramARB",userptr);
    glad_glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC)(*load)("glGetnMapdvARB",userptr);
    glad_glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC)(*load)("glGetnMapfvARB",userptr);
    glad_glGetnMapivARB = (PFNGLGETNMAPIVARBPROC)(*load)("glGetnMapivARB",userptr);
    glad_glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC)(*load)("glGetnMinmaxARB",userptr);
    glad_glGetnPixelMapfvARB = (PFNGLGETNPIXELMAPFVARBPROC)(*load)("glGetnPixelMapfvARB",userptr);
    glad_glGetnPixelMapuivARB = (PFNGLGETNPIXELMAPUIVARBPROC)(*load)("glGetnPixelMapuivARB",userptr)
    ;
    glad_glGetnPixelMapusvARB = (PFNGLGETNPIXELMAPUSVARBPROC)(*load)("glGetnPixelMapusvARB",userptr)
    ;
    glad_glGetnPolygonStippleARB =
         (PFNGLGETNPOLYGONSTIPPLEARBPROC)(*load)("glGetnPolygonStippleARB",userptr);
    glad_glGetnSeparableFilterARB =
         (PFNGLGETNSEPARABLEFILTERARBPROC)(*load)("glGetnSeparableFilterARB",userptr);
    glad_glGetnTexImageARB = (PFNGLGETNTEXIMAGEARBPROC)(*load)("glGetnTexImageARB",userptr);
    glad_glGetnUniformdvARB = (PFNGLGETNUNIFORMDVARBPROC)(*load)("glGetnUniformdvARB",userptr);
    glad_glGetnUniformfvARB = (PFNGLGETNUNIFORMFVARBPROC)(*load)("glGetnUniformfvARB",userptr);
    glad_glGetnUniformivARB = (PFNGLGETNUNIFORMIVARBPROC)(*load)("glGetnUniformivARB",userptr);
    glad_glGetnUniformuivARB = (PFNGLGETNUNIFORMUIVARBPROC)(*load)("glGetnUniformuivARB",userptr);
    glad_glReadnPixels = (PFNGLREADNPIXELSPROC)(*load)("glReadnPixels",userptr);
    glad_glReadnPixelsARB = (PFNGLREADNPIXELSARBPROC)(*load)("glReadnPixelsARB",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_robustness( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_robustness) return;
    glGetGraphicsResetStatusARB = (PFNGLGETGRAPHICSRESETSTATUSARBPROC) load("glGetGraphicsResetStatusARB", userptr);
    glGetnColorTableARB = (PFNGLGETNCOLORTABLEARBPROC) load("glGetnColorTableARB", userptr);
    glGetnCompressedTexImageARB = (PFNGLGETNCOMPRESSEDTEXIMAGEARBPROC) load("glGetnCompressedTexImageARB", userptr);
    glGetnConvolutionFilterARB = (PFNGLGETNCONVOLUTIONFILTERARBPROC) load("glGetnConvolutionFilterARB", userptr);
    glGetnHistogramARB = (PFNGLGETNHISTOGRAMARBPROC) load("glGetnHistogramARB", userptr);
    glGetnMapdvARB = (PFNGLGETNMAPDVARBPROC) load("glGetnMapdvARB", userptr);
    glGetnMapfvARB = (PFNGLGETNMAPFVARBPROC) load("glGetnMapfvARB", userptr);
    glGetnMapivARB = (PFNGLGETNMAPIVARBPROC) load("glGetnMapivARB", userptr);
    glGetnMinmaxARB = (PFNGLGETNMINMAXARBPROC) load("glGetnMinmaxARB", userptr);
    glGetnPixelMapfvARB = (PFNGLGETNPIXELMAPFVARBPROC) load("glGetnPixelMapfvARB", userptr);
    glGetnPixelMapuivARB = (PFNGLGETNPIXELMAPUIVARBPROC) load("glGetnPixelMapuivARB", userptr);
    glGetnPixelMapusvARB = (PFNGLGETNPIXELMAPUSVARBPROC) load("glGetnPixelMapusvARB", userptr);
    glGetnPolygonStippleARB = (PFNGLGETNPOLYGONSTIPPLEARBPROC) load("glGetnPolygonStippleARB", userptr);
    glGetnSeparableFilterARB = (PFNGLGETNSEPARABLEFILTERARBPROC) load("glGetnSeparableFilterARB", userptr);
    glGetnTexImageARB = (PFNGLGETNTEXIMAGEARBPROC) load("glGetnTexImageARB", userptr);
    glGetnUniformdvARB = (PFNGLGETNUNIFORMDVARBPROC) load("glGetnUniformdvARB", userptr);
    glGetnUniformfvARB = (PFNGLGETNUNIFORMFVARBPROC) load("glGetnUniformfvARB", userptr);
    glGetnUniformivARB = (PFNGLGETNUNIFORMIVARBPROC) load("glGetnUniformivARB", userptr);
    glGetnUniformuivARB = (PFNGLGETNUNIFORMUIVARBPROC) load("glGetnUniformuivARB", userptr);
    glReadnPixels = (PFNGLREADNPIXELSPROC) load("glReadnPixels", userptr);
    glReadnPixelsARB = (PFNGLREADNPIXELSARBPROC) load("glReadnPixelsARB", userptr);
}